

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void when_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  Fl_Type *pFVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  void *pvVar6;
  void **ppvVar7;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar8;
  byte bVar9;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar4 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    bVar9 = current_widget->o->when_;
    pvVar6 = (void *)0x3e8;
    if ((bVar9 & 0xfd) != 0) {
      pvVar6 = (void *)(ulong)(bVar9 & 0xfffffffd);
    }
    ppvVar7 = &whenmenu[0].user_data_;
    for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
      if (pvVar6 == *ppvVar7) {
        Fl_Choice::value(i,(int)lVar5);
        return;
      }
      ppvVar7 = ppvVar7 + 7;
    }
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      lVar5 = -1;
    }
    else {
      lVar5 = (long)(int)(((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) / 0x38);
    }
    iVar4 = (int)whenmenu[lVar5].user_data_;
    if (iVar4 != 0) {
      bVar3 = false;
      bVar9 = (byte)whenmenu[lVar5].user_data_;
      if (iVar4 == 1000) {
        bVar9 = 0;
      }
      ppFVar8 = &Fl_Type::first;
      while (pFVar2 = *ppFVar8, pFVar2 != (Fl_Type *)0x0) {
        if (pFVar2->selected != '\0') {
          iVar4 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
          if (iVar4 != 0) {
            *(byte *)((long)&(pFVar2[1].prev)->header_position + 3) =
                 *(byte *)((long)&(pFVar2[1].prev)->header_position + 3) & 2 | bVar9;
            bVar3 = true;
          }
        }
        ppFVar8 = &pFVar2->next;
      }
      if (bVar3) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void when_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->when() & (~FL_WHEN_NOT_CHANGED);
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(whenmenu)/sizeof(*whenmenu)); j++)
      if (whenmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(whenmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}